

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTcPrsOpBinGroupCompare::parse(CTcPrsOpBinGroupCompare *this)

{
  int iVar1;
  tc_toktyp_t tVar2;
  CTPNArglist *pCVar3;
  CTcToken *in_RDI;
  CTcPrsOpBinGroupCompare *in_stack_00000008;
  CTPNArglist *rhs_1;
  CTPNArglist *rhs;
  CTcPrsNode *lhs;
  CTcTokenizer *in_stack_ffffffffffffffb0;
  CTcTokenizer *in_stack_ffffffffffffffb8;
  CTcPrsNode **in_stack_ffffffffffffffd0;
  CTcPrsOpBinGroup *in_stack_ffffffffffffffd8;
  CTcTokenizer *local_18;
  
  local_18 = (CTcTokenizer *)(*(code *)**(undefined8 **)in_RDI->text_)();
  if (local_18 != (CTcTokenizer *)0x0) {
LAB_00251de9:
    do {
      iVar1 = CTcPrsOpBinGroup::find_and_apply_op
                        (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    } while (iVar1 != 0);
    tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x251e0e);
    if (tVar2 != TOKT_SYM) {
LAB_00251f10:
      tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x251f1f);
      if (tVar2 == TOKT_SYM) {
        CTcTokenizer::getcur(G_tok);
        iVar1 = CTcToken::text_matches
                          (in_RDI,(char *)in_stack_ffffffffffffffb8,
                           (size_t)in_stack_ffffffffffffffb0);
        if (iVar1 != 0) {
          tVar2 = CTcTokenizer::next(in_stack_ffffffffffffffb8);
          if (tVar2 == TOKT_SYM) {
            CTcTokenizer::getcur(G_tok);
            iVar1 = CTcToken::text_matches
                              (in_RDI,(char *)in_stack_ffffffffffffffb8,
                               (size_t)in_stack_ffffffffffffffb0);
            if (iVar1 != 0) {
              pCVar3 = parse_inlist(in_stack_00000008);
              if (pCVar3 == (CTPNArglist *)0x0) {
                return (CTcPrsNode *)0x0;
              }
              in_stack_ffffffffffffffb0 = (CTcTokenizer *)CTcPrsAllocObj::operator_new(0x251fc0);
              CTPNNotIn::CTPNNotIn
                        ((CTPNNotIn *)in_RDI,(CTcPrsNode *)in_stack_ffffffffffffffb8,
                         (CTPNArglist *)in_stack_ffffffffffffffb0);
              local_18 = in_stack_ffffffffffffffb0;
              goto LAB_00251de9;
            }
          }
          CTcTokenizer::unget((CTcTokenizer *)0x252019);
        }
      }
      return (CTcPrsNode *)local_18;
    }
    CTcTokenizer::getcur(G_tok);
    iVar1 = CTcToken::text_matches
                      (in_RDI,(char *)in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0);
    if (iVar1 == 0) goto LAB_00251f10;
    tVar2 = CTcTokenizer::next(in_stack_ffffffffffffffb8);
    if (tVar2 != TOKT_SYM) {
LAB_00251eff:
      CTcTokenizer::unget((CTcTokenizer *)0x251f0e);
      goto LAB_00251f10;
    }
    CTcTokenizer::getcur(G_tok);
    iVar1 = CTcToken::text_matches
                      (in_RDI,(char *)in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0);
    if (iVar1 == 0) goto LAB_00251eff;
    pCVar3 = parse_inlist(in_stack_00000008);
    if (pCVar3 != (CTPNArglist *)0x0) {
      in_stack_ffffffffffffffb8 = (CTcTokenizer *)CTcPrsAllocObj::operator_new(0x251eb2);
      CTPNIsIn::CTPNIsIn((CTPNIsIn *)in_RDI,(CTcPrsNode *)in_stack_ffffffffffffffb8,
                         (CTPNArglist *)in_stack_ffffffffffffffb0);
      local_18 = in_stack_ffffffffffffffb8;
      goto LAB_00251de9;
    }
  }
  return (CTcPrsNode *)0x0;
}

Assistant:

CTcPrsNode *CTcPrsOpBinGroupCompare::parse() const
{
    /* parse our left side - if that fails, return failure */
    CTcPrsNode *lhs = left_->parse();
    if (lhs == 0)
        return 0;

    /* keep going as long as we find one of our operators */
    for (;;)
    {
        /* 
         *   try one of our regular operators - if we find it, go back for
         *   another round to see if there's another operator following
         *   the next expression
         */
        if (find_and_apply_op(&lhs))
            continue;

        /* 
         *   check for the 'is in' operator - 'is' and 'in' aren't
         *   keywords, so we must check for symbol tokens with the text of
         *   these context-sensitive keywords 
         */
        if (G_tok->cur() == TOKT_SYM
            && G_tok->getcur()->text_matches("is", 2))
        {
            /* we have 'is' - get the next token and check if it's 'in' */
            if (G_tok->next() == TOKT_SYM
                && G_tok->getcur()->text_matches("in", 2))
            {
                /* scan the expression list */
                CTPNArglist *rhs = parse_inlist();
                if (rhs == 0)
                    return 0;

                /* build the node */
                lhs = new CTPNIsIn(lhs, rhs);

                /* 
                 *   we've applied the 'is in' operator - go back for
                 *   another operator from the comparison group 
                 */
                continue;
            }
            else
            {
                /* it's not 'is in' - throw back the token and keep looking */
                G_tok->unget();
            }
        }

        /*
         *   Check for the 'not in' operator 
         */
        if (G_tok->cur() == TOKT_SYM
            && G_tok->getcur()->text_matches("not", 3))
        {
            /* we have 'is' - get the next token and check if it's 'in' */
            if (G_tok->next() == TOKT_SYM
                && G_tok->getcur()->text_matches("in", 2))
            {
                /* scan the expression list */
                CTPNArglist *rhs = parse_inlist();
                if (rhs == 0)
                    return 0;

                /* build the node */
                lhs = new CTPNNotIn(lhs, rhs);

                /* 
                 *   we've applied the 'is in' operator - go back for
                 *   another operator from the comparison group 
                 */
                continue;
            }
            else
            {
                /* it's not 'is in' - throw back the token and keep looking */
                G_tok->unget();
            }
        }

        /* we didn't find any of our operators - we're done */
        break;
    }

    /* return the expression */
    return lhs;
}